

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feefrac.cpp
# Opt level: O3

partial_ordering CompareChunks(Span<const_FeeFrac> chunks0,Span<const_FeeFrac> chunks1)

{
  int iVar1;
  size_t sVar2;
  FeeFrac *pFVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  bool bVar22;
  int iVar23;
  long in_FS_OFFSET;
  bool bVar24;
  bool bVar25;
  bool better_somewhere [2];
  FeeFrac accum [2];
  size_t next_index [2];
  byte local_8a [10];
  int local_80 [2];
  undefined8 local_78;
  int local_70;
  size_t local_68 [2];
  FeeFrac *local_58 [4];
  long local_38;
  
  sVar13 = chunks1.m_size;
  sVar18 = chunks0.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = chunks0.m_data;
  local_58[2] = chunks1.m_data;
  local_68[0] = 0;
  local_68[1] = 0;
  local_8a[2] = 0;
  local_8a[3] = 0;
  local_8a[4] = 0;
  local_8a[5] = 0;
  local_8a[6] = 0;
  local_8a[7] = 0;
  local_8a[8] = 0;
  local_8a[9] = 0;
  local_80[0] = 0;
  local_78 = 0;
  local_70 = 0;
  local_8a[0] = 0;
  local_8a[1] = 0;
  bVar24 = sVar18 == 0;
  bVar25 = sVar13 == 0;
  bVar20 = 0;
  bVar19 = 0;
  if (sVar18 != 0 || sVar13 != 0) {
    do {
      bVar22 = bVar24;
      if (!bVar25 && bVar24 == false) {
        bVar22 = local_70 + chunks1.m_data[local_68[1]].size <
                 local_80[0] + chunks0.m_data[local_68[0]].size;
      }
      uVar21 = (ulong)bVar22;
      sVar2 = local_68[uVar21];
      uVar8 = (ulong)bVar22;
      pFVar3 = local_58[uVar8 * 2];
      lVar17 = *(long *)((long)local_80 + (uVar8 * 2 + -1) * 8) + pFVar3[sVar2].fee;
      bVar20 = bVar22 ^ 1;
      uVar16 = (ulong)bVar20;
      uVar12 = (ulong)bVar20;
      lVar4 = *(long *)((long)local_80 + (uVar12 * 2 + -1) * 8);
      lVar14 = lVar17 - lVar4;
      if (bVar25 || bVar24 != false) {
        if (lVar17 != lVar4) {
          bVar20 = (byte)(lVar14 >> 0x3f) | 1;
          goto LAB_0072fd17;
        }
      }
      else {
        iVar23 = pFVar3[sVar2].size + (int)*(long *)((long)local_80 + uVar8 * 2 * 8);
        sVar5 = local_68[uVar16];
        lVar6 = local_58[(ulong)bVar20 * 2][sVar5].fee;
        iVar1 = local_58[(ulong)bVar20 * 2][sVar5].size;
        uVar10 = iVar1 * lVar14;
        lVar14 = SUB168(SEXT816((long)iVar1) * SEXT816(lVar14),8);
        lVar15 = (long)(iVar23 - (int)*(long *)((long)local_80 + uVar12 * 2 * 8));
        uVar11 = lVar6 * lVar15;
        lVar15 = SUB168(SEXT816(lVar6) * SEXT816(lVar15),8);
        uVar7 = (ulong)(uVar10 < uVar11);
        bVar20 = -((SBORROW8(lVar14,lVar15) != SBORROW8(lVar14 - lVar15,uVar7)) !=
                  (long)((lVar14 - lVar15) - uVar7) < 0) | 1;
        if (uVar10 == uVar11 && lVar14 == lVar15) {
          bVar20 = 0;
        }
        if ((int)*(long *)((long)local_80 + uVar12 * 2 * 8) + iVar1 == iVar23) {
          local_68[uVar16] = sVar5 + 1;
          *(long *)((long)local_80 + (uVar12 * 2 + -1) * 8) = lVar6 + lVar4;
          *(int *)((long)local_80 + uVar12 * 2 * 8) = iVar23;
        }
LAB_0072fd17:
        uVar12 = uVar21;
        if ((bVar20 == 1) || (uVar12 = uVar16, bVar20 == 0xff)) {
          local_8a[uVar12] = 1;
        }
      }
      local_68[uVar21] = sVar2 + 1;
      *(long *)((long)local_80 + (uVar8 * 2 + -1) * 8) = lVar17;
      *(int *)((long)local_80 + uVar8 * 2 * 8) =
           (int)*(long *)((long)local_80 + uVar8 * 2 * 8) + pFVar3[sVar2].size;
      if ((local_8a[0] == 1) && (local_8a[1] != 0)) {
        bVar9 = 2;
        goto LAB_0072fd97;
      }
      bVar24 = local_68[0] == sVar18;
      bVar25 = local_68[1] == sVar13;
      bVar20 = local_8a[0];
      bVar19 = local_8a[1];
    } while (!bVar24 || !bVar25);
  }
  bVar9 = -(bVar20 < bVar19) | 1;
  if (bVar20 == bVar19) {
    bVar9 = 0;
  }
LAB_0072fd97:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (partial_ordering)bVar9;
}

Assistant:

std::partial_ordering CompareChunks(Span<const FeeFrac> chunks0, Span<const FeeFrac> chunks1)
{
    /** Array to allow indexed access to input diagrams. */
    const std::array<Span<const FeeFrac>, 2> chunk = {chunks0, chunks1};
    /** How many elements we have processed in each input. */
    size_t next_index[2] = {0, 0};
    /** Accumulated fee/sizes in diagrams, up to next_index[i] - 1. */
    FeeFrac accum[2];
    /** Whether the corresponding input is strictly better than the other at least in one place. */
    bool better_somewhere[2] = {false, false};
    /** Get the first unprocessed point in diagram number dia. */
    const auto next_point = [&](int dia) { return chunk[dia][next_index[dia]] + accum[dia]; };
    /** Get the last processed point in diagram number dia. */
    const auto prev_point = [&](int dia) { return accum[dia]; };
    /** Move to the next point in diagram number dia. */
    const auto advance = [&](int dia) { accum[dia] += chunk[dia][next_index[dia]++]; };

    do {
        bool done_0 = next_index[0] == chunk[0].size();
        bool done_1 = next_index[1] == chunk[1].size();
        if (done_0 && done_1) break;

        // Determine which diagram has the first unprocessed point. If a single side is finished, use the
        // other one. Only up to one can be done due to check above.
        const int unproc_side = (done_0 || done_1) ? done_0 : next_point(0).size > next_point(1).size;

        // Let `P` be the next point on diagram unproc_side, and `A` and `B` the previous and next points
        // on the other diagram. We want to know if P lies above or below the line AB. To determine this, we
        // compute the slopes of line AB and of line AP, and compare them. These slopes are fee per size,
        // and can thus be expressed as FeeFracs.
        const FeeFrac& point_p = next_point(unproc_side);
        const FeeFrac& point_a = prev_point(!unproc_side);

        const auto slope_ap = point_p - point_a;
        Assume(slope_ap.size > 0);
        std::weak_ordering cmp = std::weak_ordering::equivalent;
        if (done_0 || done_1) {
            // If a single side has no points left, act as if AB has slope tail_feerate(of 0).
            Assume(!(done_0 && done_1));
            cmp = FeeRateCompare(slope_ap, FeeFrac(0, 1));
        } else {
            // If both sides have points left, compute B, and the slope of AB explicitly.
            const FeeFrac& point_b = next_point(!unproc_side);
            const auto slope_ab = point_b - point_a;
            Assume(slope_ab.size >= slope_ap.size);
            cmp = FeeRateCompare(slope_ap, slope_ab);

            // If B and P have the same size, B can be marked as processed (in addition to P, see
            // below), as we've already performed a comparison at this size.
            if (point_b.size == point_p.size) advance(!unproc_side);
        }
        // If P lies above AB, unproc_side is better in P. If P lies below AB, then !unproc_side is
        // better in P.
        if (std::is_gt(cmp)) better_somewhere[unproc_side] = true;
        if (std::is_lt(cmp)) better_somewhere[!unproc_side] = true;
        advance(unproc_side);

        // If both diagrams are better somewhere, they are incomparable.
        if (better_somewhere[0] && better_somewhere[1]) return std::partial_ordering::unordered;
    } while(true);

    // Otherwise compare the better_somewhere values.
    return better_somewhere[0] <=> better_somewhere[1];
}